

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int modified_get_delivery_failed(MODIFIED_HANDLE modified,_Bool *delivery_failed_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  MODIFIED_INSTANCE *modified_instance;
  uint32_t item_count;
  int result;
  _Bool *delivery_failed_value_local;
  MODIFIED_HANDLE modified_local;
  
  if (modified == (MODIFIED_HANDLE)0x0) {
    modified_instance._4_4_ = 0x4764;
  }
  else {
    _item_count = delivery_failed_value;
    delivery_failed_value_local = (_Bool *)modified;
    iVar1 = amqpvalue_get_composite_item_count
                      (modified->composite_value,(uint32_t *)&modified_instance);
    if (iVar1 == 0) {
      if ((int)modified_instance == 0) {
        modified_instance._4_4_ = 0x4772;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(modified->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          modified_instance._4_4_ = 0x477a;
        }
        else {
          iVar1 = amqpvalue_get_boolean(value,_item_count);
          if (iVar1 == 0) {
            modified_instance._4_4_ = 0;
          }
          else {
            modified_instance._4_4_ = 0x4781;
          }
        }
      }
    }
    else {
      modified_instance._4_4_ = 0x476c;
    }
  }
  return modified_instance._4_4_;
}

Assistant:

int modified_get_delivery_failed(MODIFIED_HANDLE modified, bool* delivery_failed_value)
{
    int result;

    if (modified == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        if (amqpvalue_get_composite_item_count(modified_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(modified_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, delivery_failed_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}